

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::saveProfilingData(BrokerBase *this,string_view message)

{
  bool bVar1;
  long in_RDI;
  bool in_stack_000000bb;
  int in_stack_000000bc;
  BrokerBase *in_stack_000000c0;
  undefined1 in_stack_000000c8 [16];
  GlobalFederateId in_stack_000000dc;
  string_view in_stack_00000200;
  string *in_stack_ffffffffffffff58;
  ProfilerBuffer *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  GlobalFederateId local_50 [5];
  allocator<char> local_39 [57];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x278));
  if (bVar1) {
    CLI::std::__shared_ptr_access<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x51ae62);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    ProfilerBuffer::addMessage(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff60);
    std::allocator<char>::~allocator(local_39);
  }
  else {
    GlobalFederateId::GlobalFederateId(local_50,(GlobalBrokerId)0x0);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    sendToLogger(in_stack_000000c0,in_stack_000000dc,in_stack_000000bc,
                 (string_view)in_stack_000000c8,in_stack_00000200,in_stack_000000bb);
  }
  return;
}

Assistant:

void BrokerBase::saveProfilingData(std::string_view message)
{
    if (prBuff) {
        prBuff->addMessage(std::string(message));
    } else {
        sendToLogger(parent_broker_id, LogLevels::PROFILING, "[PROFILING]", message);
    }
}